

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

char * pigpio_error(int errnum)

{
  int in_EDI;
  char *local_8;
  
  if (in_EDI < -999) {
    switch(in_EDI) {
    case -0x7da:
      local_8 = "callback not found";
      break;
    case -0x7d9:
      local_8 = "failed to create notification thread";
      break;
    case -0x7d8:
      local_8 = "bad callback parameter";
      break;
    case -0x7d7:
      local_8 = "failed to malloc";
      break;
    case -0x7d6:
      local_8 = "identical callback exists";
      break;
    case -0x7d5:
      local_8 = "failed to open noib";
      break;
    case -0x7d4:
      local_8 = "failed to create socket";
      break;
    case -0x7d3:
      local_8 = "failed to connect to pigpiod";
      break;
    case -0x7d2:
      local_8 = "failed to find address of pigpiod";
      break;
    case -0x7d1:
      local_8 = "failed to receive from pigpiod";
      break;
    case -2000:
      local_8 = "failed to send to pigpiod";
      break;
    default:
      local_8 = "unknown error";
    }
  }
  else {
    local_8 = cmdErrStr(in_EDI);
  }
  return local_8;
}

Assistant:

char *pigpio_error(int errnum)
{
   if (errnum > -1000) return cmdErrStr(errnum);
   else
   {
      switch(errnum)
      {
         case pigif_bad_send:
            return "failed to send to pigpiod";
         case pigif_bad_recv:
            return "failed to receive from pigpiod";
         case pigif_bad_getaddrinfo:
            return "failed to find address of pigpiod";
         case pigif_bad_connect:
            return "failed to connect to pigpiod";
         case pigif_bad_socket:
            return "failed to create socket";
         case pigif_bad_noib:
            return "failed to open noib";
         case pigif_duplicate_callback:
            return "identical callback exists";
         case pigif_bad_malloc:
            return "failed to malloc";
         case pigif_bad_callback:
            return "bad callback parameter";
         case pigif_notify_failed:
            return "failed to create notification thread";
         case pigif_callback_not_found:
            return "callback not found";
         default:
            return "unknown error";
      }
   }
}